

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O0

int Kit_TruthIsop2(uint *puTruth0,uint *puTruth1,int nVars,Vec_Int_t *vMemory,int fTryBoth,
                  int fReturnTt)

{
  int iVar1;
  int local_74;
  int nWords;
  int RetValue;
  uint *pResult;
  Kit_Sop_t *pcRes2;
  Kit_Sop_t cRes2;
  Kit_Sop_t *pcRes;
  Kit_Sop_t cRes;
  int fReturnTt_local;
  int fTryBoth_local;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *puTruth1_local;
  uint *puTruth0_local;
  
  cRes2.pCubes = (uint *)&pcRes;
  local_74 = 0;
  cRes.pCubes._0_4_ = fReturnTt;
  cRes.pCubes._4_4_ = fTryBoth;
  if ((nVars < 0) || (0x10 < nVars)) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x3d,
                  "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)");
  }
  Vec_IntClear(vMemory);
  Vec_IntGrow(vMemory,0x100000);
  Kit_TruthNot(puTruth0,puTruth0,nVars);
  _nWords = Kit_TruthIsop_rec(puTruth1,puTruth0,nVars,(Kit_Sop_t *)cRes2.pCubes,vMemory);
  Kit_TruthNot(puTruth0,puTruth0,nVars);
  if (cRes2.pCubes[1] == 0xffffffff) {
    vMemory->nSize = -1;
    puTruth0_local._4_4_ = -1;
  }
  else {
    iVar1 = Kit_TruthIsImply(puTruth1,_nWords,nVars);
    if (iVar1 == 0) {
      __assert_fail("Kit_TruthIsImply( puTruth1, pResult, nVars )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                    ,0x4a,
                    "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)"
                   );
    }
    Kit_TruthNot(puTruth0,puTruth0,nVars);
    iVar1 = Kit_TruthIsImply(_nWords,puTruth0,nVars);
    if (iVar1 == 0) {
      __assert_fail("Kit_TruthIsImply( pResult, puTruth0, nVars )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                    ,0x4c,
                    "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)"
                   );
    }
    Kit_TruthNot(puTruth0,puTruth0,nVars);
    if ((cRes2.pCubes[1] == 0) || ((cRes2.pCubes[1] == 1 && (**(int **)(cRes2.pCubes + 2) == 0)))) {
      *vMemory->pArray = 0;
      Vec_IntShrink(vMemory,cRes2.pCubes[1]);
      puTruth0_local._4_4_ = 0;
    }
    else {
      if (cRes.pCubes._4_4_ != 0) {
        Kit_TruthNot(puTruth1,puTruth1,nVars);
        _nWords = Kit_TruthIsop_rec(puTruth0,puTruth1,nVars,(Kit_Sop_t *)&pcRes2,vMemory);
        Kit_TruthNot(puTruth1,puTruth1,nVars);
        if (-1 < (int)pcRes2._4_4_) {
          iVar1 = Kit_TruthIsImply(puTruth0,_nWords,nVars);
          if (iVar1 == 0) {
            __assert_fail("Kit_TruthIsImply( puTruth0, pResult, nVars )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                          ,0x5c,
                          "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)"
                         );
          }
          Kit_TruthNot(puTruth1,puTruth1,nVars);
          iVar1 = Kit_TruthIsImply(_nWords,puTruth1,nVars);
          if (iVar1 == 0) {
            __assert_fail("Kit_TruthIsImply( pResult, puTruth1, nVars )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                          ,0x5e,
                          "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)"
                         );
          }
          Kit_TruthNot(puTruth1,puTruth1,nVars);
          if (((int)pcRes2._4_4_ < (int)cRes2.pCubes[1]) ||
             ((cRes2.pCubes[1] == pcRes2._4_4_ && ((int)pcRes2 < (int)*cRes2.pCubes)))) {
            local_74 = 1;
            cRes2.pCubes = (uint *)&pcRes2;
          }
        }
      }
      if ((int)cRes.pCubes == 0) {
        memmove(vMemory->pArray,*(void **)(cRes2.pCubes + 2),(long)(int)cRes2.pCubes[1] << 2);
        Vec_IntShrink(vMemory,cRes2.pCubes[1]);
      }
      else {
        iVar1 = Kit_TruthWordNum(nVars);
        memmove(vMemory->pArray,_nWords,(long)iVar1 << 2);
        Vec_IntShrink(vMemory,iVar1);
      }
      puTruth0_local._4_4_ = local_74;
    }
  }
  return puTruth0_local._4_4_;
}

Assistant:

int Kit_TruthIsop2( unsigned * puTruth0, unsigned * puTruth1, int nVars, Vec_Int_t * vMemory, int fTryBoth, int fReturnTt )
{
    Kit_Sop_t cRes, * pcRes = &cRes;
    Kit_Sop_t cRes2, * pcRes2 = &cRes2;
    unsigned * pResult;
    int RetValue = 0;
    assert( nVars >= 0 && nVars <= 16 );
    // prepare memory manager
    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_ISOP_MEM_LIMIT );
    // compute ISOP for the direct polarity
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    pResult = Kit_TruthIsop_rec( puTruth1, puTruth0, nVars, pcRes, vMemory );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    if ( pcRes->nCubes == -1 )
    {
        vMemory->nSize = -1;
        return -1;
    }
    assert( Kit_TruthIsImply( puTruth1, pResult, nVars ) );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    assert( Kit_TruthIsImply( pResult, puTruth0, nVars ) );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    if ( pcRes->nCubes == 0 || (pcRes->nCubes == 1 && pcRes->pCubes[0] == 0) )
    {
        vMemory->pArray[0] = 0;
        Vec_IntShrink( vMemory, pcRes->nCubes );
        return 0;
    }
    if ( fTryBoth )
    {
        // compute ISOP for the complemented polarity
        Kit_TruthNot( puTruth1, puTruth1, nVars );
        pResult = Kit_TruthIsop_rec( puTruth0, puTruth1, nVars, pcRes2, vMemory );
        Kit_TruthNot( puTruth1, puTruth1, nVars );
        if ( pcRes2->nCubes >= 0 )
        {
            assert( Kit_TruthIsImply( puTruth0, pResult, nVars ) );
            Kit_TruthNot( puTruth1, puTruth1, nVars );
            assert( Kit_TruthIsImply( pResult, puTruth1, nVars ) );
            Kit_TruthNot( puTruth1, puTruth1, nVars );
            if ( pcRes->nCubes > pcRes2->nCubes || (pcRes->nCubes == pcRes2->nCubes && pcRes->nLits > pcRes2->nLits) )
            {
                RetValue = 1;
                pcRes = pcRes2;
            }
        }
    }
//    printf( "%d ", vMemory->nSize );
    // move the cover representation to the beginning of the memory buffer
    if ( fReturnTt )
    {
        int nWords = Kit_TruthWordNum( nVars );
        memmove( vMemory->pArray, pResult, nWords * sizeof(unsigned) );
        Vec_IntShrink( vMemory, nWords );
    }
    else
    {
        memmove( vMemory->pArray, pcRes->pCubes, pcRes->nCubes * sizeof(unsigned) );
        Vec_IntShrink( vMemory, pcRes->nCubes );
    }
    return RetValue;
}